

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

int ddReorderPreprocess(DdManager *table)

{
  int iVar1;
  int local_1c;
  int res;
  int i;
  DdManager *table_local;
  
  cuddCacheFlush(table);
  cuddLocalCacheClearAll(table);
  cuddGarbageCollect(table,0);
  table->isolated = 0;
  for (local_1c = 0; local_1c < table->size; local_1c = local_1c + 1) {
    if (table->vars[local_1c]->ref == 1) {
      table->isolated = table->isolated + 1;
    }
  }
  iVar1 = cuddInitInteract(table);
  table_local._4_4_ = (uint)(iVar1 != 0);
  return table_local._4_4_;
}

Assistant:

static int
ddReorderPreprocess(
  DdManager * table)
{
    int i;
    int res;

    /* Clear the cache. */
    cuddCacheFlush(table);
    cuddLocalCacheClearAll(table);

    /* Eliminate dead nodes. Do not scan the cache again. */
    cuddGarbageCollect(table,0);

    /* Initialize number of isolated projection functions. */
    table->isolated = 0;
    for (i = 0; i < table->size; i++) {
        if (table->vars[i]->ref == 1) table->isolated++;
    }

    /* Initialize the interaction matrix. */
    res = cuddInitInteract(table);
    if (res == 0) return(0);

    return(1);

}